

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinit.c
# Opt level: O0

DspInterface
X_init(DspInterface dsp,LispPTR lispbitmap,uint width_hint,uint height_hint,uint depth_hint)

{
  uint uVar1;
  Display *pDVar2;
  long lVar3;
  LispPTR *local_50;
  uint local_48;
  uint local_3c;
  Screen *Xscreen;
  uint depth_hint_local;
  uint height_hint_local;
  uint width_hint_local;
  LispPTR lispbitmap_local;
  DspInterface dsp_local;
  
  dsp->identifier = Display_Name;
  pDVar2 = (Display *)XOpenDisplay(dsp->identifier);
  dsp->display_id = pDVar2;
  if (pDVar2 == (Display *)0x0) {
    dsp_local = (DspInterface)0x0;
  }
  else {
    XSetIOErrorHandler(X_FatalErrorHandler);
    XSetIOErrorExitHandler(dsp->display_id,X_FatalErrorExitHandler,0);
    lVar3 = *(long *)(dsp->display_id + 0xe8) + (long)*(int *)(dsp->display_id + 0xe0) * 0x80;
    if (noscroll == 0) {
      dsp->ScrollBarWidth = 0x12;
      dsp->InternalBorderWidth = 2;
    }
    else {
      dsp->ScrollBarWidth = 0;
      dsp->InternalBorderWidth = 0;
    }
    (dsp->Visible).x = LispDisplayRequestedX;
    (dsp->Visible).y = LispDisplayRequestedY;
    if (height_hint == 0) {
      (dsp->Display).height =
           *(int *)(lVar3 + 0x1c) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2);
    }
    else {
      uVar1 = ubound(100,height_hint,0x800);
      (dsp->Display).height = uVar1;
    }
    if (width_hint == 0) {
      (dsp->Display).width =
           *(int *)(lVar3 + 0x18) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2);
    }
    else {
      uVar1 = ubound(0x96,width_hint,0x800);
      (dsp->Display).width = uVar1;
    }
    (dsp->Display).width = (dsp->Display).width + 0x1f & 0xffffffe0;
    (dsp->device).enter = Open_Display;
    (dsp->device).exit = lisp_Xexit;
    (dsp->device).before_raid = Xevent_before_raid;
    (dsp->device).after_raid = Xevent_after_raid;
    dsp->bitblt_to_screen = clipping_Xbitblt;
    dsp->BitGravity = 1;
    dsp->cleardisplay = GenericReturnT;
    dsp->set_color_map_entry = GenericReturnT;
    if ((dsp->Display).width <
        *(int *)(lVar3 + 0x18) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2)) {
      local_3c = (dsp->Display).width;
    }
    else {
      local_3c = *(int *)(lVar3 + 0x18) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2);
    }
    uVar1 = ubound(dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2,LispWindowRequestedWidth,
                   local_3c);
    (dsp->Visible).width = uVar1;
    if ((dsp->Display).height <
        *(int *)(lVar3 + 0x1c) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2)) {
      local_48 = (dsp->Display).height;
    }
    else {
      local_48 = *(int *)(lVar3 + 0x1c) - (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2);
    }
    uVar1 = ubound(dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2,LispWindowRequestedHeight,
                   local_48);
    (dsp->Visible).height = uVar1;
    (dsp->ScreenBitmap).width = (dsp->Display).width;
    (dsp->ScreenBitmap).height = (dsp->Display).height;
    (dsp->ScreenBitmap).xoffset = 0;
    dsp->bitsperpixel =
         (unsigned_short)
         *(undefined4 *)
          (*(long *)(dsp->display_id + 0xe8) + (long)*(int *)(dsp->display_id + 0xe0) * 0x80 + 0x38)
    ;
    (dsp->ScreenBitmap).byte_order = 0;
    if (lispbitmap == 0) {
      local_50 = (LispPTR *)0x0;
    }
    else {
      local_50 = NativeAligned4FromLAddr(lispbitmap);
    }
    (dsp->ScreenBitmap).data = (char *)local_50;
    if (depth_hint == 8) {
      (dsp->ScreenBitmap).format = 2;
      (dsp->ScreenBitmap).bitmap_unit = *(int *)(dsp->display_id + 0x54);
      (dsp->ScreenBitmap).bitmap_bit_order = 1;
      (dsp->ScreenBitmap).bitmap_pad = 0x20;
      (dsp->ScreenBitmap).depth = 8;
      (dsp->ScreenBitmap).bits_per_pixel = 8;
      (dsp->ScreenBitmap).bytes_per_line = (dsp->Display).width;
      (dsp->ScreenBitmap).red_mask = 7;
      (dsp->ScreenBitmap).green_mask = 7;
      (dsp->ScreenBitmap).blue_mask = 3;
    }
    else {
      (dsp->ScreenBitmap).format = 0;
      (dsp->ScreenBitmap).bitmap_unit = *(int *)(dsp->display_id + 0x54);
      (dsp->ScreenBitmap).bitmap_bit_order = 1;
      (dsp->ScreenBitmap).bitmap_pad = 0x20;
      (dsp->ScreenBitmap).depth = 1;
      (dsp->ScreenBitmap).bits_per_pixel = 1;
      (dsp->ScreenBitmap).bytes_per_line = ((dsp->Display).width + 0xf >> 4) << 1;
    }
    XInitImage(&dsp->ScreenBitmap);
    dsp_local = dsp;
  }
  return dsp_local;
}

Assistant:

DspInterface X_init(DspInterface dsp, LispPTR lispbitmap, unsigned width_hint, unsigned height_hint,
                    unsigned depth_hint)
{
  Screen *Xscreen;

  dsp->identifier = Display_Name; /* This is a hack. The display name */
                                  /* has to dealt with in a more */
                                  /* graceful way. */

  /* Try to open the X display. If this isn't possible, we just */
  /* return FALSE. */
  if ((dsp->display_id = XOpenDisplay(dsp->identifier)) == NULL) return (NULL);

  XSetIOErrorHandler(X_FatalErrorHandler);
  XSetIOErrorExitHandler(dsp->display_id, X_FatalErrorExitHandler, NULL);

  /* Load the dsp structure */

  Xscreen = ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id));

  /* Set the scrollbar and border widths */
  if (noscroll == 0) {
    dsp->ScrollBarWidth = SCROLL_WIDTH;
    dsp->InternalBorderWidth = DEF_BDRWIDE;
  } else {
    dsp->ScrollBarWidth = 0;
    dsp->InternalBorderWidth = 0;
  }

  dsp->Visible.x = LispDisplayRequestedX;
  dsp->Visible.y = LispDisplayRequestedY;

  /* Set the width and height of the display.  */
  if (height_hint == 0) {
    dsp->Display.height =
      (unsigned)HeightOfScreen(Xscreen) - OUTER_SB_WIDTH(dsp); /* In the default case,
                                                          adjust for scroll gadgets*/
  } else
    dsp->Display.height = ubound(WIN_MIN_HEIGHT, height_hint, WIN_MAX_HEIGHT);

  if (width_hint == 0) {
    dsp->Display.width =
      (unsigned)WidthOfScreen(Xscreen) - OUTER_SB_WIDTH(dsp); /* In the default case,
                                                         adjust for scroll gadgets*/
  } else
    dsp->Display.width = ubound(WIN_MIN_WIDTH, width_hint, WIN_MAX_WIDTH);

  /************************************************************/
  /* 		Set the size of ScreenBitMap                  */
  /* The display's width is rounded to a 32-bit multiple,     */
  /* so that little-Endian machines can display right.        */
  /************************************************************/
  dsp->Display.width = ((dsp->Display.width + 31) >> 5) << 5;

  /*
   * Device methods
   */
  dsp->device.enter = (void (*)(void *))Open_Display;
  dsp->device.exit = (void (*)(void *))lisp_Xexit;
  dsp->device.before_raid = (void (*)(void *))Xevent_before_raid;
  dsp->device.after_raid = (void (*)(void *))Xevent_after_raid;

  dsp->bitblt_to_screen = clipping_Xbitblt;

  dsp->BitGravity = NorthWestGravity;

  dsp->cleardisplay = (unsigned long (*)(DspInterface))GenericReturnT;
  dsp->set_color_map_entry = GenericReturnT;

  /* Set the geometry of the Visible (Lisp) window. */
  dsp->Visible.width =
      ubound(OUTER_SB_WIDTH(dsp), LispWindowRequestedWidth,
            min(dsp->Display.width, (unsigned)WidthOfScreen(Xscreen) - OUTER_SB_WIDTH(dsp)));
  dsp->Visible.height =
      ubound(OUTER_SB_WIDTH(dsp), LispWindowRequestedHeight,
            min(dsp->Display.height, (unsigned)HeightOfScreen(Xscreen) - OUTER_SB_WIDTH(dsp)));

  /* Initialize the screen image structure. */
  dsp->ScreenBitmap.width = (int)dsp->Display.width;
  dsp->ScreenBitmap.height = (int)dsp->Display.height;
  dsp->ScreenBitmap.xoffset = 0;
  dsp->bitsperpixel =
    (unsigned short)DefaultDepthOfScreen(ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id)));
#if (defined(BYTESWAP))
  dsp->ScreenBitmap.byte_order = LSBFirst;
#else  /* BYTESWAP */
  dsp->ScreenBitmap.byte_order = MSBFirst;
#endif /* BYTESWAP */

  dsp->ScreenBitmap.data = (char *)(lispbitmap ? NativeAligned4FromLAddr((LispPTR)lispbitmap) : 0);

  switch (depth_hint) {
    case 8: /* Color Screen */
      dsp->ScreenBitmap.format = ZPixmap;
      dsp->ScreenBitmap.bitmap_unit = BitmapUnit(dsp->display_id);
      dsp->ScreenBitmap.bitmap_bit_order = MSBFirst;
      dsp->ScreenBitmap.bitmap_pad = 32;
      dsp->ScreenBitmap.depth = 8;
      dsp->ScreenBitmap.bits_per_pixel = 8;
      dsp->ScreenBitmap.bytes_per_line = (int)dsp->Display.width;
      dsp->ScreenBitmap.red_mask = 7;
      dsp->ScreenBitmap.green_mask = 7;
      dsp->ScreenBitmap.blue_mask = 3;
      break;
    default: /* B/W Screen */
      dsp->ScreenBitmap.format = XYBitmap;
      dsp->ScreenBitmap.bitmap_unit = BitmapUnit(dsp->display_id);
      dsp->ScreenBitmap.bitmap_bit_order = MSBFirst;
      dsp->ScreenBitmap.bitmap_pad = 32;
      dsp->ScreenBitmap.depth = 1;
      dsp->ScreenBitmap.bits_per_pixel = 1;
      dsp->ScreenBitmap.bytes_per_line =
          ((dsp->Display.width + (BITSPER_DLWORD - 1)) / BITSPER_DLWORD) * (BITSPER_DLWORD / 8);
      break;
  }
  XInitImage(&dsp->ScreenBitmap);
  return (dsp);
}